

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_headers.h
# Opt level: O2

size_t __thiscall cppcms::impl::response_headers::estimate_size(response_headers *this)

{
  _Rb_tree_node_base *p_Var1;
  _List_node_base *p_Var2;
  headers_type *__range2;
  undefined1 *puVar3;
  
  puVar3 = (undefined1 *)0x20;
  for (p_Var1 = (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->headers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    puVar3 = &(p_Var1[2]._M_parent)->field_0x4 +
             (long)((long)&(p_Var1[1]._M_parent)->_M_color + (long)puVar3);
  }
  p_Var2 = (_List_node_base *)&this->added_headers_;
  while (p_Var2 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->added_headers_) {
    puVar3 = puVar3 + (long)p_Var2[1]._M_prev + 2;
  }
  return (size_t)puVar3;
}

Assistant:

size_t estimate_size() const
	{
		size_t n=32; // final crfl + http header
		for(auto const &h : headers_) {
			n+=h.first.size() + h.second.size() + 4; // ": " "\r\n"
		}
		for(auto const &h : added_headers_) {
			n+=h.size() + 2; // add crlf
		}
		return n;
	}